

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qglobalstatic.h
# Opt level: O2

Type * __thiscall
QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_loader>_>::operator()
          (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_loader>_> *this)

{
  int iVar1;
  undefined1 *puVar2;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  QArrayDataPointer<char16_t> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if ((char)QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_loader>::guard._q_value.
            super___atomic_base<signed_char>._M_i < -1) {
    puVar2 = (Type *)0x0;
  }
  else {
    puVar2 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_loader>>::instance()
             ::holder;
    if (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_loader>>::instance()::
        holder == '\0') {
      iVar1 = __cxa_guard_acquire(&QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_loader>>
                                   ::instance()::holder);
      if (iVar1 != 0) {
        latin1.m_data = "/printsupport";
        latin1.m_size = 0xd;
        QString::QString((QString *)&local_30,latin1);
        puVar2 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_loader>>::
                 instance()::holder;
        QFactoryLoader::QFactoryLoader
                  ((QFactoryLoader *)
                   QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_loader>>::
                   instance()::holder,"org.qt-project.QPlatformPrinterSupportFactoryInterface.5.1",
                   (QString *)&local_30,CaseInsensitive);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_30);
        QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_loader>::guard._q_value.
        super___atomic_base<signed_char>._M_i = (Type)(__atomic_base<signed_char>)0xff;
        __cxa_atexit(QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_loader>::~Holder,
                     QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_loader>>::
                     instance()::holder,&__dso_handle);
        __cxa_guard_release(&QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_loader>>
                             ::instance()::holder);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (Type *)puVar2;
  }
  __stack_chk_fail();
}

Assistant:

Type *operator()()
    {
        if (isDestroyed())
            return nullptr;
        return instance();
    }